

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFileOpenDialog::sendCancelEvent(CGUIFileOpenDialog *this)

{
  SEvent event;
  
  (**(code **)(**(long **)&this->field_0x20 + 0x10))();
  return;
}

Assistant:

void CGUIFileOpenDialog::sendCancelEvent()
{
	SEvent event;
	event.EventType = EET_GUI_EVENT;
	event.GUIEvent.Caller = this;
	event.GUIEvent.Element = 0;
	event.GUIEvent.EventType = EGET_FILE_CHOOSE_DIALOG_CANCELLED;
	Parent->OnEvent(event);
}